

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

void __thiscall BufferedReader::notify(BufferedReader *this,int readerID,uint32_t dataReaded)

{
  ReaderData *pRVar1;
  int local_24;
  
  pRVar1 = getReader(this,readerID);
  if (((pRVar1 != (ReaderData *)0x0) &&
      ((this->super_AbstractReader).m_prereadThreshold <= dataReaded)) &&
     (pRVar1->m_notified == false)) {
    std::mutex::lock(&this->m_readersMtx);
    pRVar1->m_notified = true;
    pRVar1->m_atQueue = pRVar1->m_atQueue + 1;
    SafeQueueWithNotification<int>::push
              (&(this->m_readQueue).super_SafeQueueWithNotification<int>,&local_24);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  }
  return;
}

Assistant:

void BufferedReader::notify(const int readerID, const uint32_t dataReaded)
{
    ReaderData* data = getReader(readerID);
    if (data == nullptr)
        return;
    if (dataReaded >= m_prereadThreshold && !data->m_notified)
    {
        std::lock_guard lock(m_readersMtx);
        data->m_notified = true;
        data->m_atQueue++;
        m_readQueue.push(readerID);
    }
}